

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Serialize.h
# Opt level: O0

Package * __thiscall
chatra::Reader::readValidIdType<chatra::PackageId,chatra::Package>
          (Reader *this,Reader *r,IdPool<chatra::PackageId,_chatra::Package> *pool)

{
  Package *pPVar1;
  IllegalArgumentException *this_00;
  Package *value;
  IdPool<chatra::PackageId,_chatra::Package> *pool_local;
  Reader *r_local;
  Reader *this_local;
  
  pPVar1 = readIdType<chatra::PackageId,chatra::Package>(this,r,pool);
  if (pPVar1 == (Package *)0x0) {
    this_00 = (IllegalArgumentException *)__cxa_allocate_exception(0x28);
    memset(this_00,0,0x28);
    IllegalArgumentException::IllegalArgumentException(this_00);
    __cxa_throw(this_00,&IllegalArgumentException::typeinfo,
                IllegalArgumentException::~IllegalArgumentException);
  }
  return pPVar1;
}

Assistant:

ValueType* readValidIdType(Reader& r, IdPool<KeyType, ValueType>& pool) {
		auto* value = readIdType(r, pool);
		if (value == nullptr)
			throw IllegalArgumentException();
		return value;
	}